

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O1

_Bool Hacl_P256_ecdsa_verif_p256_sha2
                (uint32_t msg_len,uint8_t *msg,uint8_t *public_key,uint8_t *signature_r,
                uint8_t *signature_s)

{
  ulong uVar1;
  ulong uVar2;
  _Bool _Var3;
  uint64_t uVar4;
  ulong uVar5;
  uint64_t t1;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t m_q [4];
  uint8_t mHash [32];
  uint64_t local_78;
  ulong uStack_70;
  ulong local_68;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  ulong local_48;
  ulong uStack_40;
  
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  Hacl_Hash_SHA2_hash_256((uint8_t *)&local_58,msg,msg_len);
  uVar6 = uStack_40 >> 0x38 | (uStack_40 & 0xff000000000000) >> 0x28 |
          (uStack_40 & 0xff0000000000) >> 0x18 | (uStack_40 & 0xff00000000) >> 8 |
          (uStack_40 & 0xff000000) << 8 | (uStack_40 & 0xff0000) << 0x18 |
          (uStack_40 & 0xff00) << 0x28 | uStack_40 << 0x38;
  uVar8 = local_48 >> 0x38 | (local_48 & 0xff000000000000) >> 0x28 |
          (local_48 & 0xff0000000000) >> 0x18 | (local_48 & 0xff00000000) >> 8 |
          (local_48 & 0xff000000) << 8 | (local_48 & 0xff0000) << 0x18 | (local_48 & 0xff00) << 0x28
          | local_48 << 0x38;
  uVar7 = uStack_50 >> 0x38 | (uStack_50 & 0xff000000000000) >> 0x28 |
          (uStack_50 & 0xff0000000000) >> 0x18 | (uStack_50 & 0xff00000000) >> 8 |
          (uStack_50 & 0xff000000) << 8 | (uStack_50 & 0xff0000) << 0x18 |
          (uStack_50 & 0xff00) << 0x28 | uStack_50 << 0x38;
  uVar5 = local_58 >> 0x38 | (local_58 & 0xff000000000000) >> 0x28 |
          (local_58 & 0xff0000000000) >> 0x18 | (local_58 & 0xff00000000) >> 8 |
          (local_58 & 0xff000000) << 8 | (local_58 & 0xff0000) << 0x18 | (local_58 & 0xff00) << 0x28
          | local_58 << 0x38;
  uVar1 = (ulong)(uVar8 < 0xbce6faada7179e84 ||
                 uVar8 + 0x4319055258e8617c < (ulong)(uVar6 < 0xf3b9cac2fc632551));
  uVar2 = (ulong)(uVar7 != 0xffffffffffffffff || uVar7 + 1 < uVar1);
  local_78 = uVar6;
  uStack_70 = uVar8;
  local_68 = uVar7;
  uStack_60 = uVar5;
  uVar4 = FStar_UInt64_eq_mask((ulong)(uVar5 < 0xffffffff00000000 || uVar5 + 0x100000000 < uVar2),0)
  ;
  local_78 = (uVar6 + 0xc46353d039cdaaf ^ uVar6) & uVar4 ^ uVar6;
  uStack_70 = ((uVar8 + 0x4319055258e8617c) - (ulong)(uVar6 < 0xf3b9cac2fc632551) ^ uVar8) & uVar4 ^
              uVar8;
  local_68 = ((uVar7 + 1) - uVar1 ^ uVar7) & uVar4 ^ uVar7;
  uStack_60 = ((uVar5 + 0x100000000) - uVar2 ^ uVar5) & uVar4 ^ uVar5;
  _Var3 = ecdsa_verify_msg_as_qelem(&local_78,public_key,signature_r,signature_s);
  return _Var3;
}

Assistant:

bool
Hacl_P256_ecdsa_verif_p256_sha2(
  uint32_t msg_len,
  uint8_t *msg,
  uint8_t *public_key,
  uint8_t *signature_r,
  uint8_t *signature_s
)
{
  uint64_t m_q[4U] = { 0U };
  uint8_t mHash[32U] = { 0U };
  Hacl_Hash_SHA2_hash_256(mHash, msg, msg_len);
  KRML_MAYBE_UNUSED_VAR(msg_len);
  uint8_t *mHash32 = mHash;
  bn_from_bytes_be4(m_q, mHash32);
  qmod_short(m_q, m_q);
  bool res = ecdsa_verify_msg_as_qelem(m_q, public_key, signature_r, signature_s);
  return res;
}